

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O2

char * p2sc_timestamp(double t,int prec)

{
  undefined4 uVar1;
  undefined4 uVar2;
  tm *ptVar3;
  char *pcVar4;
  double v;
  time_t s;
  double local_58;
  double i;
  timeval tv;
  
  if (t < 0.0) {
    gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
    t = (double)tv.tv_usec / 1000000.0 + (double)tv.tv_sec;
  }
  v = modf(t,&i);
  s = (long)i;
  local_58 = p2sc_round(v,prec);
  if (1.0 <= local_58) {
    s = (long)i + 1;
    local_58 = 0.0;
  }
  ptVar3 = gmtime(&s);
  if (ptVar3 != (tm *)0x0) {
    uVar1 = ptVar3->tm_mon;
    uVar2 = ptVar3->tm_year;
    tv.tv_usec._0_4_ = SUB84((double)(uVar1 + 1),0);
    tv.tv_sec = (__time_t)(double)(uVar2 + 0x76c);
    tv.tv_usec._4_4_ = (int)((ulong)(double)(uVar1 + 1) >> 0x20);
    pcVar4 = p2sc_date2string((double *)&tv);
    return pcVar4;
  }
  _p2sc_msg("p2sc_timestamp",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_time.c"
            ,0x8b,"$Id: p2sc_time.c 5348 2018-04-25 13:55:17Z bogdan $",4000,"gmtime(%f)",(double)s)
  ;
  exit(1);
}

Assistant:

char *p2sc_timestamp(double t, int prec) {
    if (t < 0) {
        struct timeval tv;
        gettimeofday(&tv, NULL);
        t = tv.tv_sec + tv.tv_usec / 1000000.;
        // t = g_get_real_time() / 1000000.; for glib-2.0>=2.28
    }

    double i, f = modf(t, &i);
    time_t s = i;

    f = p2sc_round(f, prec);
    if (f >= 1) {
        ++s;
        f = 0;
    }

    struct tm *tm = gmtime(&s);
    if (!tm)
        P2SC_Msg(LVL_FATAL, "gmtime(%f)", (double) s);

    double tt[6] = {
        tm->tm_year + 1900, tm->tm_mon + 1, tm->tm_mday,
        tm->tm_hour, tm->tm_min, tm->tm_sec + f
    };

    return p2sc_date2string(tt);
}